

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

int leveldb::FindFile(InternalKeyComparator *icmp,
                     vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     *files,Slice *key)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  Slice local_40;
  
  uVar5 = 0;
  uVar1 = (ulong)((long)(files->
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(files->
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 3;
  while (uVar3 = uVar1, uVar4 = (uint)uVar3, uVar5 < uVar4) {
    uVar4 = uVar5 + uVar4 >> 1;
    local_40 = InternalKey::Encode(&(files->
                                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar4]->largest);
    iVar2 = InternalKeyComparator::Compare(icmp,&local_40,key);
    uVar1 = (ulong)uVar4;
    if (iVar2 < 0) {
      uVar5 = uVar4 + 1;
      uVar1 = uVar3;
    }
  }
  return uVar4;
}

Assistant:

int FindFile(const InternalKeyComparator& icmp,
             const std::vector<FileMetaData*>& files, const Slice& key) {
  uint32_t left = 0;
  uint32_t right = files.size();
  while (left < right) {
    uint32_t mid = (left + right) / 2;
    const FileMetaData* f = files[mid];
    if (icmp.InternalKeyComparator::Compare(f->largest.Encode(), key) < 0) {
      // Key at "mid.largest" is < "target".  Therefore all
      // files at or before "mid" are uninteresting.
      left = mid + 1;
    } else {
      // Key at "mid.largest" is >= "target".  Therefore all files
      // after "mid" are uninteresting.
      right = mid;
    }
  }
  return right;
}